

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O1

bool processCmd(string *cmd)

{
  pointer pcVar1;
  char cVar2;
  int iVar3;
  int *piVar4;
  longlong lVar5;
  bool bVar6;
  undefined1 *puVar7;
  char *pcVar8;
  string *psVar9;
  long lVar10;
  undefined1 auVar11 [12];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  string sourcePath;
  path p;
  string possibleCmds [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  char *local_198;
  long local_190;
  char local_188 [16];
  undefined1 *local_178;
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"put","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"read","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"mkdir","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"put2","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"read2","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"quit","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"fetch","");
  puVar7 = local_48;
  local_58[0] = puVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"fetch2","");
  split(&local_1b0,cmd,' ');
  iVar3 = std::__cxx11::string::compare
                    ((string *)
                     local_1b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (iVar3 == 0) {
    type = put;
    if ((long)local_1b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
LAB_0010f0cc:
      lVar10 = 0x1b;
      pcVar8 = "Usage: put source_file_path";
      goto LAB_0010f382;
    }
    local_198 = local_188;
    pcVar1 = local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar1,
               pcVar1 + local_1b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    std::ifstream::open((string *)ifs,(_Ios_Openmode)&local_198);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: the input file does not exist",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
    }
    else {
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char*>((string *)local_158,local_198,local_198 + local_190)
      ;
      boost::filesystem::path::filename();
      std::__cxx11::string::_M_append((char *)&desFileName_abi_cxx11_,(ulong)local_178);
      if (local_178 != local_168) {
        operator_delete(local_178);
      }
      if (local_158[0] != local_148) {
        operator_delete(local_158[0]);
      }
    }
LAB_0010f16a:
    if (local_198 != local_188) {
      operator_delete(local_198);
    }
    if (cVar2 != '\0') goto LAB_0010f47d;
  }
  else {
    iVar3 = std::__cxx11::string::compare
                      ((string *)
                       local_1b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar3 == 0) {
      type = read;
      if ((long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x80) {
        lVar10 = 0x20;
        pcVar8 = "Usage: read file_id offset count";
        goto LAB_0010f382;
      }
      pcVar8 = local_1b0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      *piVar4 = 0;
      lVar10 = strtol(pcVar8,&local_198,10);
      if (local_198 == pcVar8) {
        std::__throw_invalid_argument("stoi");
LAB_0010f500:
        std::__throw_out_of_range("stoi");
LAB_0010f50c:
        std::__throw_invalid_argument("stoll");
LAB_0010f518:
        std::__throw_invalid_argument("stoi");
      }
      else {
        if (((int)lVar10 != lVar10) || (*piVar4 == 0x22)) goto LAB_0010f500;
        if (*piVar4 == 0) {
          *piVar4 = iVar3;
        }
        pcVar8 = local_1b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        iVar3 = *piVar4;
        read_fileId = (int)lVar10;
        *piVar4 = 0;
        lVar5 = strtoll(pcVar8,&local_198,10);
        if (local_198 == pcVar8) goto LAB_0010f50c;
        if (*piVar4 == 0) {
          *piVar4 = iVar3;
        }
        else if (*piVar4 == 0x22) {
          std::__throw_out_of_range("stoll");
          goto LAB_0010f0cc;
        }
        pcVar8 = local_1b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
        iVar3 = *piVar4;
        read_offset = lVar5;
        *piVar4 = 0;
        lVar10 = strtol(pcVar8,&local_198,10);
        if (local_198 == pcVar8) goto LAB_0010f518;
        if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*piVar4 != 0x22)) {
          if (*piVar4 == 0) {
            *piVar4 = iVar3;
          }
LAB_0010f477:
          read_count = (int)lVar10;
          goto LAB_0010f47d;
        }
      }
      std::__throw_out_of_range("stoi");
LAB_0010f530:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Bye: Exit miniDFS",0x11);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      exit(0);
    }
    iVar3 = std::__cxx11::string::compare
                      ((string *)
                       local_1b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar3 == 0) {
      type = mkdir;
      if ((long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x40) {
        psVar9 = &mkdir_path_abi_cxx11_;
LAB_0010f109:
        std::__cxx11::string::_M_assign((string *)psVar9);
        goto LAB_0010f47d;
      }
      lVar10 = 0x13;
      pcVar8 = "Usage: mkdir folder";
    }
    else {
      iVar3 = std::__cxx11::string::compare
                        ((string *)
                         local_1b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare
                          ((string *)
                           local_1b0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare
                            ((string *)
                             local_1b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if (iVar3 == 0) goto LAB_0010f530;
          iVar3 = std::__cxx11::string::compare
                            ((string *)
                             local_1b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if (iVar3 == 0) {
            type = fetch;
            if ((long)local_1b0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1b0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0x60) {
              lVar10 = 0x1e;
              pcVar8 = "Usage: fetch file_id save_path";
              goto LAB_0010f4d7;
            }
            fetch_id = std::__cxx11::stoi(local_1b0.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1,
                                          (size_t *)0x0,10);
            std::__cxx11::string::_M_assign((string *)&fetch_savepath_abi_cxx11_);
          }
          else {
            iVar3 = std::__cxx11::string::compare
                              ((string *)
                               local_1b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            if (iVar3 == 0) {
              type = fetch2;
              if ((long)local_1b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x60) {
                std::__cxx11::string::_M_assign((string *)&fetch_filepath_abi_cxx11_);
                psVar9 = &fetch_savepath_abi_cxx11_;
                goto LAB_0010f109;
              }
              lVar10 = 0x21;
              pcVar8 = "Usage: fetch2 file_path save_path";
LAB_0010f4d7:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar8,lVar10);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              goto LAB_0010f3bc;
            }
          }
LAB_0010f47d:
          bVar6 = true;
          goto LAB_0010f47f;
        }
        type = read2;
        if ((long)local_1b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x80) {
          lVar10 = 0x23;
          pcVar8 = "Usage: read2 file_path offset count";
          goto LAB_0010f382;
        }
        std::__cxx11::string::_M_assign((string *)&read_filename_abi_cxx11_);
        pcVar8 = local_1b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        piVar4 = __errno_location();
        iVar3 = *piVar4;
        *piVar4 = 0;
        lVar5 = strtoll(pcVar8,&local_198,10);
        if (local_198 == pcVar8) {
          std::__throw_invalid_argument("stoll");
LAB_0010f567:
          std::__throw_invalid_argument("stoi");
        }
        else {
          if (*piVar4 == 0) {
            *piVar4 = iVar3;
          }
          else if (*piVar4 == 0x22) {
            std::__throw_out_of_range("stoll");
            goto LAB_0010f317;
          }
          pcVar8 = local_1b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          iVar3 = *piVar4;
          read_offset = lVar5;
          *piVar4 = 0;
          lVar10 = strtol(pcVar8,&local_198,10);
          if (local_198 == pcVar8) goto LAB_0010f567;
          if (((int)lVar10 == lVar10) && (*piVar4 != 0x22)) {
            if (*piVar4 == 0) {
              *piVar4 = iVar3;
            }
            goto LAB_0010f477;
          }
        }
        auVar11 = std::__throw_out_of_range("stoi");
        if (auVar11._8_4_ != 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1b0);
          lVar10 = -0x100;
          do {
            if (puVar7 != *(undefined1 **)(puVar7 + -0x10)) {
              operator_delete(*(undefined1 **)(puVar7 + -0x10));
            }
            puVar7 = puVar7 + -0x20;
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0);
          _Unwind_Resume(auVar11._0_8_);
        }
        __cxa_begin_catch(auVar11._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: id isn\'t a number",0x18);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        __cxa_end_catch();
        goto LAB_0010f3bc;
      }
      type = put2;
      if ((long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x60) {
        local_198 = local_188;
        pcVar1 = local_1b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,pcVar1,
                   pcVar1 + local_1b0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        std::ifstream::open((string *)ifs,(_Ios_Openmode)&local_198);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: the input file does not exist",0x24);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
          std::ostream::put('0');
          std::ostream::flush();
        }
        else {
          std::__cxx11::string::_M_assign((string *)&desFileName_abi_cxx11_);
        }
        goto LAB_0010f16a;
      }
LAB_0010f317:
      lVar10 = 0x2c;
      pcVar8 = "Usage: put2 source_file_path des_file_folder";
    }
LAB_0010f382:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,lVar10);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
LAB_0010f3bc:
  bVar6 = false;
LAB_0010f47f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  lVar10 = 0;
  do {
    if (local_48 + lVar10 != *(undefined1 **)((long)local_58 + lVar10)) {
      operator_delete(*(undefined1 **)((long)local_58 + lVar10));
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x100);
  return bVar6;
}

Assistant:

bool processCmd(const string& cmd)
{
    string possibleCmds[] = {"put", "read", "mkdir", "put2", "read2", "quit", "fetch", "fetch2"};

    vector<string> x = split(cmd, ' ');
    if (x[0].compare(possibleCmds[0]) == 0)
    {
        type = MsgType::put;
        if (x.size() != 2)
        {
            cerr << "Usage: put source_file_path" << endl;
            return false;
        }
        string sourcePath = x[1];
        ifs.open(sourcePath);
        if (! ifs.is_open())
        {
            cerr << "Error: the input file does not exist" << endl;
            return false;
        }

        boost::filesystem::path p(sourcePath);

        desFileName += p.filename().string();

    }
    else if (x[0].compare(possibleCmds[1]) == 0)
    {
        type = MsgType::read;
        if (x.size() != 4)
        {
            cerr << "Usage: read file_id offset count" << endl;
            return false;
        }

        try {
            read_fileId = stoi(x[1]);
            read_offset = stoll(x[2]);
            read_count = stoi(x[3]);
        }
        catch (exception& e)
        {
            std::cout << "Error: id, offset or count isn't a number" << std::endl;
            return false;
        }

    }
    else if(x[0].compare(possibleCmds[2]) == 0){
        type = MsgType::mkdir;
        if (x.size() != 2)
        {
            cerr << "Usage: mkdir folder" << endl;
            return false;
        }
        mkdir_path = x[1];

    }
    else if(x[0].compare(possibleCmds[3]) == 0)
    {
        type = MsgType::put2;
        if (x.size() != 3)
        {
            cerr << "Usage: put2 source_file_path des_file_folder" << endl;
            return false;
        }
        string sourcePath = x[1];
        ifs.open(sourcePath);
        if (! ifs.is_open())
        {
            cerr << "Error: the input file does not exist" << endl;
            return false;
        }

        desFileName = x[2];

    }
    else if (x[0].compare(possibleCmds[4]) == 0)
    {
        type = MsgType::read2;
        if (x.size() != 4)
        {
            cerr << "Usage: read2 file_path offset count" << endl;
            return false;
        }

        read_filename = x[1];

        try {
            read_offset = stoll(x[2]);
            read_count = stoi(x[3]);
        }
        catch (exception& e)
        {
            std::cout << "Error: offset or count isn't a number" << std::endl;
            return false;
        }

    }
    else if (x[0].compare(possibleCmds[5]) == 0)
    {
        cout << "Bye: Exit miniDFS" << endl;
        exit(0);
    }
    else if (x[0].compare(possibleCmds[6]) == 0)
    {
        type = MsgType::fetch;
        // fetch files
        if (x.size() != 3)
        {
            cerr << "Usage: fetch file_id save_path" << endl;
            return false;
        }

        try {
            fetch_id = stoi(x[1]);
            fetch_savepath = x[2];
        }
        catch (exception& e)
        {
            std::cout << "Error: id isn't a number" << std::endl;
            return false;
        }

    }
    else if (x[0].compare(possibleCmds[7]) == 0)
    {
        type = MsgType::fetch2;
        // fetch files
        if (x.size() != 3)
        {
            cerr << "Usage: fetch2 file_path save_path" << endl;
            return false;
        }

        fetch_filepath = x[1];
        fetch_savepath = x[2];
    }

    return true;
}